

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::loop
          (TestMoreStuffImpl *this,uint depth,Client *cap,ExpectCancelContext context)

{
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar1;
  undefined4 in_register_00000034;
  TestMoreStuffImpl *in_R8;
  Promise<void> PVar2;
  Type local_88;
  AddFailureAdapter local_48;
  CallContextHook *local_30;
  Client *cap_local;
  TestMoreStuffImpl *pTStack_20;
  uint depth_local;
  TestMoreStuffImpl *this_local;
  ExpectCancelContext context_local;
  
  local_88.this = (TestMoreStuffImpl *)CONCAT44(in_register_00000034,depth);
  local_88.depth = (uint)cap;
  local_30 = context.hook;
  cap_local._4_4_ = local_88.depth;
  pTStack_20 = local_88.this;
  context_local.hook = (CallContextHook *)this;
  if (local_88.depth < 0x65) {
    this_local = in_R8;
    capnproto_test::capnp::test::TestInterface::Client::Client(&local_88.cap,(Client *)context.hook)
    ;
    local_88.context.hook = (CallContextHook *)this_local;
    kj::
    evalLater<capnp::_::TestMoreStuffImpl::loop(unsigned_int,capnproto_test::capnp::test::TestInterface::Client,capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>)::__0>
              ((kj *)this,&local_88);
    loop(unsigned_int,capnproto_test::capnp::test::TestInterface::Client,capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>)
    ::$_0::~__0((__0 *)&local_88);
    pPVar1 = extraout_RDX_00;
  }
  else {
    kj::AddFailureAdapter::AddFailureAdapter
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x45b);
    kj::AddFailureAdapter::operator<<(&local_48,(char (*) [28])"Looped too long, giving up.");
    kj::AddFailureAdapter::~AddFailureAdapter(&local_48);
    kj::Promise<void>::Promise((Promise<void> *)this);
    pPVar1 = extraout_RDX;
  }
  PVar2.super_PromiseBase.node.ptr = pPVar1;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::loop(uint depth, test::TestInterface::Client cap,
                                          ExpectCancelContext context) {
  if (depth > 100) {
    ADD_FAILURE() << "Looped too long, giving up.";
    return kj::READY_NOW;
  } else {
    return kj::evalLater([this,depth,KJ_CPCAP(cap),KJ_CPCAP(context)]() mutable {
      return loop(depth + 1, cap, context);
    });
  }